

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_freqt(HTS_Vocoder *v,double *c1,int m1,double *c2,int m2,double a)

{
  double dVar1;
  double dVar2;
  double *ptr;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  double *__s;
  bool bVar8;
  
  uVar4 = (ulong)m2;
  ptr = v->freqt_buff;
  uVar5 = v->freqt_size;
  if (uVar5 < uVar4) {
    if (ptr != (double *)0x0) {
      HTS_free(ptr);
    }
    ptr = (double *)HTS_calloc((long)(m2 * 2 + 2),8);
    v->freqt_buff = ptr;
    v->freqt_size = uVar4;
    uVar5 = uVar4;
  }
  __s = ptr + uVar5 + 1;
  if (-1 < m2) {
    memset(__s,0,(ulong)(uint)m2 * 8 + 8);
  }
  if (-1 < m1) {
    iVar7 = -m1;
    do {
      if (-1 < m2) {
        dVar1 = *__s;
        dVar2 = c1[(uint)-iVar7];
        *ptr = dVar1;
        *__s = a * dVar1 + dVar2;
        if (m2 != 0) {
          dVar1 = ptr[uVar5 + 2];
          ptr[1] = dVar1;
          ptr[uVar5 + 2] = *ptr * (1.0 - a * a) + dVar1 * a;
          if (1 < m2) {
            lVar6 = 0;
            do {
              dVar1 = ptr[uVar5 + lVar6 + 3];
              ptr[lVar6 + 2] = dVar1;
              ptr[uVar5 + lVar6 + 3] = (dVar1 - ptr[uVar5 + lVar6 + 2]) * a + ptr[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while ((ulong)(m2 + 1) - 2 != lVar6);
          }
        }
      }
      bVar8 = iVar7 != 0;
      iVar7 = iVar7 + 1;
    } while (bVar8);
  }
  iVar7 = m2 + 1;
  lVar6 = (long)iVar7;
  if (c2 < __s) {
    if (iVar7 != 0) {
      lVar3 = 0;
      do {
        c2[lVar3] = __s[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
  }
  else if (iVar7 != 0) {
    do {
      c2[lVar6 + -1] = ptr[uVar5 + lVar6];
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

static void HTS_freqt(HTS_Vocoder * v, const double *c1, const int m1, double *c2, const int m2, const double a)
{
   int i, j;
   const double b = 1 - a * a;
   double *g;

   if (m2 > v->freqt_size) {
      if (v->freqt_buff != NULL)
         HTS_free(v->freqt_buff);
      v->freqt_buff = (double *) HTS_calloc(m2 + m2 + 2, sizeof(double));
      v->freqt_size = m2;
   }
   g = v->freqt_buff + v->freqt_size + 1;

   for (i = 0; i < m2 + 1; i++)
      g[i] = 0.0;

   for (i = -m1; i <= 0; i++) {
      if (0 <= m2)
         g[0] = c1[-i] + a * (v->freqt_buff[0] = g[0]);
      if (1 <= m2)
         g[1] = b * v->freqt_buff[0] + a * (v->freqt_buff[1] = g[1]);
      for (j = 2; j <= m2; j++)
         g[j] = v->freqt_buff[j - 1] + a * ((v->freqt_buff[j] = g[j]) - g[j - 1]);
   }

   HTS_movem(g, c2, m2 + 1);
}